

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu541.c
# Opt level: O3

MPP_RET hal_h264e_vepu541_init(void *hal,MppEncHalCfg *cfg)

{
  MppEncCfgSet *pMVar1;
  MPP_RET MVar2;
  RockchipSocType RVar3;
  char *fmt;
  
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter %p\n","hal_h264e_vepu541_init",hal);
  }
  *(MppEncCfgSet **)hal = cfg->cfg;
  cfg->type = VPU_CLIENT_RKVENC;
  MVar2 = mpp_dev_init(&cfg->dev,VPU_CLIENT_RKVENC);
  if (MVar2 == MPP_OK) {
    *(MppDev *)((long)hal + 8) = cfg->dev;
    RVar3 = mpp_get_soc_type();
    *(uint *)((long)hal + 0x10) = (uint)((RVar3 - ROCKCHIP_SOC_RK3566 & 0xfffffffd) == 0);
    MVar2 = hal_bufs_init((HalBufs *)((long)hal + 0x18));
    if (MVar2 == MPP_OK) {
      *(long *)((long)hal + 0x188) = (long)hal + 0x1b8;
      *(undefined8 *)((long)hal + 400) = *(undefined8 *)((long)hal + 8);
      *(undefined8 *)((long)hal + 0x198) = 0;
      *(long *)((long)hal + 0x1a0) = *hal + 0x1438;
      *(undefined8 *)((long)hal + 0x1a8) = 0;
      *(undefined8 *)((long)hal + 0x1b0) = 0;
      pMVar1 = cfg->cfg;
      (pMVar1->hw).qp_delta_row = 2;
      (pMVar1->hw).qp_delta_row_i = 0;
      (pMVar1->hw).qbias_i = 0x2ab;
      (pMVar1->hw).qbias_p = 0x155;
      (pMVar1->hw).qbias_en = 0;
      (pMVar1->hw).aq_thrd_i[0xc] = 0xf;
      (pMVar1->hw).aq_thrd_i[0xd] = 0x14;
      (pMVar1->hw).aq_thrd_i[0xe] = 0x19;
      (pMVar1->hw).aq_thrd_i[0xf] = 0x19;
      (pMVar1->hw).aq_thrd_i[8] = 8;
      (pMVar1->hw).aq_thrd_i[9] = 8;
      (pMVar1->hw).aq_thrd_i[10] = 8;
      (pMVar1->hw).aq_thrd_i[0xb] = 0xf;
      (pMVar1->hw).aq_thrd_i[4] = 3;
      (pMVar1->hw).aq_thrd_i[5] = 3;
      (pMVar1->hw).aq_thrd_i[6] = 5;
      (pMVar1->hw).aq_thrd_i[7] = 5;
      (pMVar1->hw).aq_thrd_i[0] = 0;
      (pMVar1->hw).aq_thrd_i[1] = 0;
      (pMVar1->hw).aq_thrd_i[2] = 0;
      (pMVar1->hw).aq_thrd_i[3] = 0;
      (pMVar1->hw).aq_thrd_p[0xc] = 0xf;
      (pMVar1->hw).aq_thrd_p[0xd] = 0x14;
      (pMVar1->hw).aq_thrd_p[0xe] = 0x19;
      (pMVar1->hw).aq_thrd_p[0xf] = 0x19;
      (pMVar1->hw).aq_thrd_p[8] = 8;
      (pMVar1->hw).aq_thrd_p[9] = 8;
      (pMVar1->hw).aq_thrd_p[10] = 8;
      (pMVar1->hw).aq_thrd_p[0xb] = 0xf;
      (pMVar1->hw).aq_thrd_p[4] = 3;
      (pMVar1->hw).aq_thrd_p[5] = 3;
      (pMVar1->hw).aq_thrd_p[6] = 5;
      (pMVar1->hw).aq_thrd_p[7] = 5;
      (pMVar1->hw).aq_thrd_p[0] = 0;
      (pMVar1->hw).aq_thrd_p[1] = 0;
      (pMVar1->hw).aq_thrd_p[2] = 0;
      (pMVar1->hw).aq_thrd_p[3] = 0;
      (pMVar1->hw).aq_step_i[0xc] = 4;
      (pMVar1->hw).aq_step_i[0xd] = 5;
      (pMVar1->hw).aq_step_i[0xe] = 8;
      (pMVar1->hw).aq_step_i[0xf] = 8;
      (pMVar1->hw).aq_step_i[8] = 0;
      (pMVar1->hw).aq_step_i[9] = 1;
      (pMVar1->hw).aq_step_i[10] = 3;
      (pMVar1->hw).aq_step_i[0xb] = 3;
      (pMVar1->hw).aq_step_i[4] = -4;
      (pMVar1->hw).aq_step_i[5] = -3;
      (pMVar1->hw).aq_step_i[6] = -2;
      (pMVar1->hw).aq_step_i[7] = -1;
      (pMVar1->hw).aq_step_i[0] = -8;
      (pMVar1->hw).aq_step_i[1] = -7;
      (pMVar1->hw).aq_step_i[2] = -6;
      (pMVar1->hw).aq_step_i[3] = -5;
      (pMVar1->hw).aq_step_p[0xc] = 4;
      (pMVar1->hw).aq_step_p[0xd] = 5;
      (pMVar1->hw).aq_step_p[0xe] = 7;
      (pMVar1->hw).aq_step_p[0xf] = 8;
      (pMVar1->hw).aq_step_p[8] = 0;
      (pMVar1->hw).aq_step_p[9] = 1;
      (pMVar1->hw).aq_step_p[10] = 2;
      (pMVar1->hw).aq_step_p[0xb] = 3;
      (pMVar1->hw).aq_step_p[4] = -4;
      (pMVar1->hw).aq_step_p[5] = -3;
      (pMVar1->hw).aq_step_p[6] = -2;
      (pMVar1->hw).aq_step_p[7] = -1;
      (pMVar1->hw).aq_step_p[0] = -8;
      (pMVar1->hw).aq_step_p[1] = -7;
      (pMVar1->hw).aq_step_p[2] = -6;
      (pMVar1->hw).aq_step_p[3] = -5;
      MVar2 = MPP_OK;
      goto LAB_0021b645;
    }
    fmt = "init vepu buffer failed ret: %d\n";
  }
  else {
    fmt = "mpp_dev_init failed. ret: %d\n";
  }
  _mpp_log_l(2,"hal_h264e_vepu541",fmt,"hal_h264e_vepu541_init",(ulong)(uint)MVar2);
  hal_h264e_vepu541_deinit(hal);
LAB_0021b645:
  h264e_vepu_stream_amend_init((HalH264eVepuStreamAmend *)((long)hal + 0x70));
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave %p\n","hal_h264e_vepu541_init",hal);
  }
  return MVar2;
}

Assistant:

static MPP_RET hal_h264e_vepu541_init(void *hal, MppEncHalCfg *cfg)
{
    HalH264eVepu541Ctx *p = (HalH264eVepu541Ctx *)hal;
    MPP_RET ret = MPP_OK;

    hal_h264e_dbg_func("enter %p\n", p);

    p->cfg = cfg->cfg;

    /* update output to MppEnc */
    cfg->type = VPU_CLIENT_RKVENC;
    ret = mpp_dev_init(&cfg->dev, cfg->type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        goto DONE;
    }
    p->dev = cfg->dev;

    {
        RockchipSocType soc_type = mpp_get_soc_type();

        if (soc_type == ROCKCHIP_SOC_RK3566 || soc_type == ROCKCHIP_SOC_RK3568)
            p->is_vepu540 = 1;
        else
            p->is_vepu540 = 0;
    }

    ret = hal_bufs_init(&p->hw_recn);
    if (ret) {
        mpp_err_f("init vepu buffer failed ret: %d\n", ret);
        goto DONE;
    }

    p->osd_cfg.reg_base = &p->regs_set;
    p->osd_cfg.dev = p->dev;
    p->osd_cfg.reg_cfg = NULL;
    p->osd_cfg.plt_cfg = &p->cfg->plt_cfg;
    p->osd_cfg.osd_data = NULL;
    p->osd_cfg.osd_data2 = NULL;

    {   /* setup default hardware config */
        MppEncHwCfg *hw = &cfg->cfg->hw;

        hw->qp_delta_row_i  = 0;
        hw->qp_delta_row    = 2;
        hw->qbias_i         = 683;
        hw->qbias_p         = 341;
        hw->qbias_en        = 0;

        memcpy(hw->aq_thrd_i, h264_aq_tthd_default, sizeof(hw->aq_thrd_i));
        memcpy(hw->aq_thrd_p, h264_aq_tthd_default, sizeof(hw->aq_thrd_p));
        memcpy(hw->aq_step_i, h264_I_aq_step_default, sizeof(hw->aq_step_i));
        memcpy(hw->aq_step_p, h264_P_aq_step_default, sizeof(hw->aq_step_p));
    }

DONE:
    if (ret)
        hal_h264e_vepu541_deinit(hal);

    h264e_vepu_stream_amend_init(&p->amend);

    hal_h264e_dbg_func("leave %p\n", p);
    return ret;
}